

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

int json_enum_option(lua_State *l,int optindex,int *setting,char **options,int bool_true)

{
  int iVar1;
  int local_2c;
  char **ppcStack_28;
  int bool_true_local;
  char **options_local;
  int *setting_local;
  int optindex_local;
  lua_State *l_local;
  
  local_2c = bool_true;
  ppcStack_28 = options;
  if (options == (char **)0x0) {
    ppcStack_28 = json_enum_option::bool_options;
    local_2c = 1;
  }
  iVar1 = lua_type(l,optindex);
  if (iVar1 != 0) {
    if ((local_2c == 0) || (iVar1 = lua_type(l,optindex), iVar1 != 1)) {
      iVar1 = luaL_checkoption(l,optindex,(char *)0x0,ppcStack_28);
      *setting = iVar1;
    }
    else {
      iVar1 = lua_toboolean(l,optindex);
      *setting = iVar1 * local_2c;
    }
  }
  if ((local_2c == 0) || ((*setting != 0 && (*setting != local_2c)))) {
    lua_pushstring(l,ppcStack_28[*setting]);
  }
  else {
    lua_pushboolean(l,*setting);
  }
  return 1;
}

Assistant:

static int json_enum_option(lua_State *l, int optindex, int *setting,
                            const char **options, int bool_true)
{
    static const char *bool_options[] = { "off", "on", NULL };

    if (!options) {
        options = bool_options;
        bool_true = 1;
    }

    if (!lua_isnil(l, optindex)) {
        if (bool_true && lua_isboolean(l, optindex))
            *setting = lua_toboolean(l, optindex) * bool_true;
        else
            *setting = luaL_checkoption(l, optindex, NULL, options);
    }

    if (bool_true && (*setting == 0 || *setting == bool_true))
        lua_pushboolean(l, *setting);
    else
        lua_pushstring(l, options[*setting]);

    return 1;
}